

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O3

void __thiscall djb::npf::npf(npf *this,char *uber_texture,char *name)

{
  pointer __ptr;
  int iVar1;
  FILE *__stream;
  exc *this_00;
  int i;
  ulong uVar2;
  undefined **ppuVar3;
  
  (this->super_brdf_rgb).super_brdf._vptr_brdf = (_func_int **)&PTR_eval_002075f0;
  (this->m_uber_texture).super__Vector_base<djb::vec3,_std::allocator<djb::vec3>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_uber_texture).super__Vector_base<djb::vec3,_std::allocator<djb::vec3>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_uber_texture).super__Vector_base<djb::vec3,_std::allocator<djb::vec3>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->m_id = -1;
  this->m_first = true;
  __stream = fopen(uber_texture,"rb");
  if (__stream == (FILE *)0x0) {
    this_00 = (exc *)__cxa_allocate_exception(0x28);
    exc::exc(this_00,"djb_error: Failed to load %s\n",uber_texture);
  }
  else {
    std::vector<djb::vec3,_std::allocator<djb::vec3>_>::resize(&this->m_uber_texture,0x20000);
    __ptr = (this->m_uber_texture).super__Vector_base<djb::vec3,_std::allocator<djb::vec3>_>._M_impl
            .super__Vector_impl_data._M_start;
    fread(__ptr,0xc,
          ((long)(this->m_uber_texture).super__Vector_base<djb::vec3,_std::allocator<djb::vec3>_>.
                 _M_impl.super__Vector_impl_data._M_finish - (long)__ptr >> 2) * -0x5555555555555555
          ,__stream);
    fclose(__stream);
    ppuVar3 = &s_list;
    uVar2 = 0;
    do {
      iVar1 = strcmp(*ppuVar3,name);
      if (iVar1 == 0) {
        this->m_id = (int)uVar2;
        fprintf(_stdout,"djb_verbose: MERL ID: %i\n",uVar2 & 0xffffffff);
        break;
      }
      uVar2 = uVar2 + 1;
      ppuVar3 = ppuVar3 + 1;
    } while (uVar2 != 100);
    if (this->m_id != -1) {
      return;
    }
    this_00 = (exc *)__cxa_allocate_exception(0x28);
    exc::exc(this_00,"djb_error: No NPF parameters for %s\n",name);
  }
  __cxa_throw(this_00,&exc::typeinfo,exc::~exc);
}

Assistant:

npf::npf(const char *uber_texture, const char *name):
    m_uber_texture(), m_id(-1), m_first(true)
{
	// load the uber_texture
	FILE *pf = fopen(uber_texture, "rb");
	if (!pf)
		throw exc("djb_error: Failed to load %s\n", uber_texture);

	m_uber_texture.resize(512*256);
	fread(&m_uber_texture[0], sizeof(m_uber_texture[0]), m_uber_texture.size(), pf);
	fclose(pf);

	// extract id from name
	for (int i = 0; i < 100; ++i) {
		if (!strcmp(s_list[i], name)) {
			m_id = i;
#ifndef NVERBOSE
			DJB_LOG("djb_verbose: MERL ID: %i\n", m_id);
#endif
			break;
		}
	}
	if (m_id == -1) throw exc("djb_error: No NPF parameters for %s\n", name);
}